

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O3

int __thiscall Fl_Tree_Item::move(Fl_Tree_Item *this,Fl_Tree_Item *item,int op,int pos)

{
  Fl_Tree_Item *pFVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint from;
  long lVar5;
  Fl_Tree_Item *pFVar6;
  uint to;
  ulong uVar7;
  Fl_Tree_Item *newparent;
  
  uVar7 = (ulong)(uint)pos;
  if (op == 2) {
    pFVar6 = this->_parent;
    lVar3 = (long)(pFVar6->_children)._total;
    from = 0xffffffff;
    newparent = item;
    if (0 < lVar3) {
      lVar5 = 0;
      do {
        if ((pFVar6->_children)._items[lVar5] == this) {
          from = (uint)lVar5;
          break;
        }
        lVar5 = lVar5 + 1;
      } while (lVar3 != lVar5);
    }
  }
  else {
    if (op == 1) {
      pFVar6 = this->_parent;
      newparent = item->_parent;
      lVar3 = (long)(pFVar6->_children)._total;
      to = 0xffffffff;
      lVar5 = 0xffffffff;
      if (0 < lVar3) {
        lVar5 = 0;
        do {
          if ((pFVar6->_children)._items[lVar5] == this) goto LAB_001da997;
          lVar5 = lVar5 + 1;
        } while (lVar3 != lVar5);
        lVar5 = 0xffffffff;
      }
LAB_001da997:
      from = (uint)lVar5;
      uVar4 = (ulong)(newparent->_children)._total;
      if ((long)uVar4 < 1) goto LAB_001da9f4;
      uVar7 = 0;
      do {
        if ((newparent->_children)._items[uVar7] == item) goto LAB_001da9ef;
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
    else {
      if (op != 0) {
        return -3;
      }
      pFVar6 = this->_parent;
      newparent = item->_parent;
      lVar3 = (long)(pFVar6->_children)._total;
      to = 0xffffffff;
      lVar5 = 0xffffffff;
      if (0 < lVar3) {
        lVar5 = 0;
        do {
          if ((pFVar6->_children)._items[lVar5] == this) goto LAB_001da93a;
          lVar5 = lVar5 + 1;
        } while (lVar3 != lVar5);
        lVar5 = 0xffffffff;
      }
LAB_001da93a:
      from = (uint)lVar5;
      uVar4 = (ulong)(newparent->_children)._total;
      if ((long)uVar4 < 1) goto LAB_001da9f4;
      uVar7 = 0;
      do {
        if ((newparent->_children)._items[uVar7] == item) goto LAB_001da9ef;
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
    uVar7 = 0xffffffff;
  }
LAB_001da9ef:
  to = (uint)uVar7;
  if (newparent == (Fl_Tree_Item *)0x0) {
    return -1;
  }
LAB_001da9f4:
  if ((int)(from | to) < 0) {
    return -2;
  }
  if (pFVar6 == newparent) {
    if (op == 1) {
      if ((int)to < (int)from) {
        to = ((int)to < (newparent->_children)._total) + to;
      }
    }
    else if (op == 0) {
      to = to - (0 < (int)to && (int)from < (int)to);
    }
    iVar2 = Fl_Tree_Item_Array::move(&pFVar6->_children,to,from);
    if (iVar2 < 0) {
      return -4;
    }
  }
  else {
    if ((newparent->_children)._total < (int)to) {
      return -4;
    }
    pFVar1 = (pFVar6->_children)._items[(int)from];
    iVar2 = Fl_Tree_Item_Array::deparent(&pFVar6->_children,from);
    if (iVar2 < 0) {
      return -5;
    }
    if (pFVar1 == (Fl_Tree_Item *)0x0) {
      return -5;
    }
    iVar2 = Fl_Tree_Item_Array::reparent(&newparent->_children,this,newparent,to);
    if (iVar2 < 0) {
      iVar2 = Fl_Tree_Item_Array::reparent(&newparent->_children,this,newparent,0);
      if (iVar2 < 0) {
        return -6;
      }
      this->_parent = newparent;
      return -6;
    }
    this->_parent = newparent;
  }
  return 0;
}

Assistant:

int Fl_Tree_Item::move(Fl_Tree_Item *item, int op, int pos) {
  Fl_Tree_Item *from_parent, *to_parent;
  int from, to;
  switch (op) {
    case 0:	// "above"
      from_parent = this->parent();
      to_parent   = item->parent();
      from        = from_parent->find_child(this);
      to          = to_parent->find_child(item);
      break;
    case 1:	// "below"
      from_parent = this->parent();
      to_parent   = item->parent();
      from        = from_parent->find_child(this);
      to          = to_parent->find_child(item);
      break;
    case 2:	// "into"
      from_parent = this->parent();
      to_parent   = item;
      from        = from_parent->find_child(this);
      to          = pos;
      break;
    default:
      return -3;
  }
  if ( !from_parent || !to_parent ) return -1;
  if ( from < 0 || to < 0 ) return -2;
  if ( from_parent == to_parent ) {		// same parent?
    switch (op) {				// 'to' offsets due to scroll
      case 0: if ( from < to && to > 0 ) --to; break;
      case 1: if ( from > to && to < to_parent->children() ) ++to; break;
    }
    if ( from_parent->move(to, from) < 0 )	// simple move among siblings
      return -4;
  } else {					// different parent?
    if ( to > to_parent->children() )		// try to prevent a reparent() error
      return -4;
    if ( from_parent->deparent(from) == NULL )	// deparent self from current parent
      return -5;
    if ( to_parent->reparent(this, to) < 0 ) {	// reparent self to new parent at position 'to'
      to_parent->reparent(this, 0);		// failed? shouldn't happen, reparent at 0
      return -6;
    }
  }
  return 0;
}